

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_tcplisten.c
# Opt level: O0

int tcp_listener_set_listen_fd(void *arg,void *buf,size_t sz,nni_type t)

{
  int iVar1;
  int *piVar2;
  socklen_t local_c4;
  int rv;
  socklen_t len;
  sockaddr_storage ss;
  int fd;
  tcp_listener *l;
  nni_type t_local;
  size_t sz_local;
  void *buf_local;
  void *arg_local;
  
  local_c4 = 0x80;
  arg_local._4_4_ = nni_copyin_int((int *)((long)&ss.__ss_align + 4),buf,sz,0,0x7fffffff,t);
  if (arg_local._4_4_ == 0) {
    iVar1 = getsockname(ss.__ss_align._4_4_,(sockaddr *)&rv,&local_c4);
    if (iVar1 == 0) {
      iVar1 = nni_posix_sockaddr2nn((nni_sockaddr *)((long)arg + 0x50),&rv,(ulong)local_c4);
      if ((iVar1 == 0) && (((short)rv == 2 || ((short)rv == 10)))) {
        nni_mtx_lock((nni_mtx *)((long)arg + 0x130));
        if ((*(byte *)((long)arg + 0x128) & 1) == 0) {
          if ((*(byte *)((long)arg + 0x129) & 1) == 0) {
            nni_posix_pfd_init((nni_posix_pfd *)((long)arg + 0xd8),ss.__ss_align._4_4_,
                               tcp_listener_cb,arg);
            *(undefined1 *)((long)arg + 0x128) = 1;
            nni_mtx_unlock((nni_mtx *)((long)arg + 0x130));
            arg_local._4_4_ = 0;
          }
          else {
            nni_mtx_unlock((nni_mtx *)((long)arg + 0x130));
            arg_local._4_4_ = 7;
          }
        }
        else {
          nni_mtx_unlock((nni_mtx *)((long)arg + 0x130));
          arg_local._4_4_ = 4;
        }
      }
      else {
        arg_local._4_4_ = 0xf;
      }
    }
    else {
      piVar2 = __errno_location();
      arg_local._4_4_ = nni_plat_errno(*piVar2);
    }
  }
  return arg_local._4_4_;
}

Assistant:

static int
tcp_listener_set_listen_fd(void *arg, const void *buf, size_t sz, nni_type t)
{
	tcp_listener           *l = arg;
	int                     fd;
	struct sockaddr_storage ss;
	socklen_t               len = sizeof(ss);
	int                     rv;

	if ((rv = nni_copyin_int(&fd, buf, sz, 0, NNI_MAXINT, t)) != 0) {
		return (rv);
	}

	if (getsockname(fd, (void *) &ss, &len) != 0) {
		return (nni_plat_errno(errno));
	}

	if (((nni_posix_sockaddr2nn(&l->sa, &ss, len)) != 0) ||
#ifdef NNG_ENABLE_IPV6
	    ((ss.ss_family != AF_INET) && (ss.ss_family != AF_INET6))
#else
	    (ss.ss_family != AF_INET)
#endif
	) {
		return (NNG_EADDRINVAL);
	}

	nni_mtx_lock(&l->mtx);
	if (l->started) {
		nni_mtx_unlock(&l->mtx);
		return (NNG_EBUSY);
	}
	if (l->closed) {
		nni_mtx_unlock(&l->mtx);
		return (NNG_ECLOSED);
	}
	nni_posix_pfd_init(&l->pfd, fd, tcp_listener_cb, l);
	l->started = true;
	nni_mtx_unlock(&l->mtx);
	return (0);
}